

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

void asmjit::v1_14::JitAllocatorImpl_fillPattern(void *mem,uint32_t pattern,size_t byteSize)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  int iVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  
  if (byteSize != 0 && ((ulong)mem & 1) != 0) {
    *(char *)mem = (char)pattern;
    mem = (void *)((long)mem + 1);
    byteSize = byteSize - 1;
  }
  if (1 < byteSize && ((ulong)mem & 2) != 0) {
    *(short *)mem = (short)pattern;
    mem = (void *)((long)mem + 2);
    byteSize = byteSize - 2;
  }
  auVar1 = _DAT_0014dc40;
  if ((byteSize & 3) != 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/jitallocator.cpp"
               ,0x230,"(byteSize & 0x3u) == 0u");
  }
  if (byteSize != 0) {
    lVar3 = (byteSize >> 2) - 1;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar2 = 0;
    auVar4 = auVar4 ^ _DAT_0014dc40;
    auVar6 = _DAT_0014dc20;
    auVar7 = _DAT_0014dc30;
    do {
      auVar8 = auVar7 ^ auVar1;
      iVar5 = auVar4._4_4_;
      if ((bool)(~(auVar8._4_4_ == iVar5 && auVar4._0_4_ < auVar8._0_4_ || iVar5 < auVar8._4_4_) & 1
                )) {
        *(uint32_t *)((long)mem + uVar2 * 2 * 2) = pattern;
      }
      if ((auVar8._12_4_ != auVar4._12_4_ || auVar8._8_4_ <= auVar4._8_4_) &&
          auVar8._12_4_ <= auVar4._12_4_) {
        *(uint32_t *)((long)mem + (uVar2 * 2 + 2) * 2) = pattern;
      }
      auVar8 = auVar6 ^ auVar1;
      iVar9 = auVar8._4_4_;
      if (iVar9 <= iVar5 && (iVar9 != iVar5 || auVar8._0_4_ <= auVar4._0_4_)) {
        *(uint32_t *)((long)mem + (uVar2 * 2 + 4) * 2) = pattern;
        *(uint32_t *)((long)mem + (uVar2 * 2 + 6) * 2) = pattern;
      }
      uVar2 = uVar2 + 4;
      lVar3 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar3 + 4;
      lVar3 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 4;
      auVar6._8_8_ = lVar3 + 4;
    } while (((byteSize >> 2) + 3 & 0xfffffffffffffffc) != uVar2);
  }
  return;
}

Assistant:

ASMJIT_NOINLINE
ASMJIT_FAVOR_SPEED static void JitAllocatorImpl_fillPattern(void* mem, uint32_t pattern, size_t byteSize) noexcept {
  // NOTE: This is always used to fill a pattern in allocated / freed memory. The allocation has always
  // a granularity that is greater than the pattern, however, when shrink() is used, we may end up having
  // an unaligned start, so deal with it here and then copy aligned pattern in the loop.
  if ((uintptr_t(mem) & 0x1u) && byteSize >= 1u) {
    static_cast<uint8_t*>(mem)[0] = uint8_t(pattern & 0xFF);
    mem = static_cast<uint8_t*>(mem) + 1;
    byteSize--;
  }

  if ((uintptr_t(mem) & 0x2u) && byteSize >= 2u) {
    static_cast<uint16_t*>(mem)[0] = uint16_t(pattern & 0xFFFF);
    mem = static_cast<uint16_t*>(mem) + 1;
    byteSize -= 2;
  }

  // Something would be seriously broken if we end up with aligned `mem`, but unaligned `byteSize`.
  ASMJIT_ASSERT((byteSize & 0x3u) == 0u);

  uint32_t* mem32 = static_cast<uint32_t*>(mem);
  size_t n = byteSize / 4u;

  for (size_t i = 0; i < n; i++)
    mem32[i] = pattern;
}